

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

wchar_t main(wchar_t argc,char **argv)

{
  undefined8 *puVar1;
  bool bVar2;
  _Bool _Var3;
  bool bVar4;
  byte bVar5;
  wchar_t wVar6;
  int iVar7;
  _Bool *p_Var8;
  char *str;
  char *pcVar9;
  passwd *ppVar10;
  bool bVar11;
  long lVar12;
  wchar_t wVar13;
  long lVar14;
  game_mode_type mode;
  char *pcVar15;
  wchar_t local_66c;
  char **local_668;
  char *local_660;
  char configpath [512];
  char local_438 [511];
  undefined1 local_239;
  char libpath [512];
  
  argv0 = *argv;
  umask(0x12);
  player_uid = getuid();
  safe_setuid_drop();
  my_strcpy(configpath,"./lib/",0x200);
  my_strcpy(libpath,"./lib/",0x200);
  my_strcpy(local_438,"./lib/",0x200);
  configpath[0x1ff] = '\0';
  libpath[0x1ff] = '\0';
  local_239 = 0;
  _Var3 = suffix(configpath,"/");
  if (!_Var3) {
    my_strcat(configpath,"/",0x200);
  }
  _Var3 = suffix(libpath,"/");
  if (!_Var3) {
    my_strcat(libpath,"/",0x200);
  }
  _Var3 = suffix(local_438,"/");
  if (!_Var3) {
    my_strcat(local_438,"/",0x200);
  }
  init_file_paths(configpath,libpath,local_438);
  bVar11 = true;
  bVar5 = 0;
  bVar4 = false;
  local_660 = (char *)0x0;
  local_66c = argc;
  local_668 = argv;
  for (wVar13 = L'\x01'; (bVar11 && (local_66c - wVar13 != L'\0' && wVar13 <= local_66c));
      wVar13 = wVar13 + L'\x01') {
    pcVar9 = local_668[wVar13];
    if (*pcVar9 != '-') {
      pcVar15 = pcVar9 + 1;
      bVar2 = true;
      goto switchD_0012618e_caseD_65;
    }
    pcVar15 = pcVar9 + 2;
    bVar11 = true;
    bVar2 = true;
    switch(pcVar9[1]) {
    case 'c':
      bVar4 = true;
      break;
    case 'd':
      if (*pcVar15 == '\0') {
        quit_fmt("Try \'-d<dir>=<path>\'.");
      }
      pcVar9 = string_make(pcVar15);
      pcVar15 = strtok(pcVar9,"=");
      str = strtok((char *)0x0,"=");
      lVar14 = 0;
      do {
        lVar12 = lVar14;
        if (lVar12 + 0x18 == 0x150) {
          quit_fmt("Unrecognised -d parameter %s",pcVar15);
          goto LAB_0012633e;
        }
        wVar6 = my_stricmp(pcVar15,*(char **)((long)&change_path_values[0].name + lVar12));
        lVar14 = lVar12 + 0x18;
      } while (wVar6 != L'\0');
      puVar1 = *(undefined8 **)((long)&change_path_values[0].path + lVar12);
      string_free((char *)*puVar1);
      pcVar15 = string_make(str);
      *puVar1 = pcVar15;
      path_build(configpath,0x200,str,"");
      _Var3 = dir_create(configpath);
      if (!_Var3) {
        quit_fmt("Cannot create \'%s\'",configpath);
      }
      string_free(pcVar9);
      goto LAB_0012633e;
    case 'e':
    case 'h':
    case 'i':
    case 'j':
    case 'k':
    case 'o':
    case 'p':
    case 'q':
    case 'r':
    case 's':
    case 't':
    case 'v':
      goto switchD_0012618e_caseD_65;
    case 'f':
      p_Var8 = &arg_force_name;
      goto LAB_001262ca;
    case 'g':
      arg_graphics = L'\x02';
      if (*pcVar15 != '\0') {
        arg_graphics = atoi(pcVar15);
      }
      break;
    case 'l':
      list_saves();
      exit(0);
    case 'm':
      bVar11 = true;
      bVar2 = true;
      pcVar9 = pcVar15;
      if (*pcVar15 == '\0') goto switchD_0012618e_caseD_65;
      goto LAB_00126428;
    case 'n':
      bVar5 = 1;
      bVar11 = true;
      break;
    case 'u':
      bVar2 = bVar11;
      if (*pcVar15 == '\0') goto switchD_0012618e_caseD_65;
      my_strcpy(arg_name,pcVar15,0x20);
      savefile_set_name(pcVar15,false,false);
LAB_0012633e:
      bVar11 = true;
      pcVar9 = local_660;
      goto LAB_00126428;
    case 'w':
      p_Var8 = &arg_wizard;
LAB_001262ca:
      *p_Var8 = true;
      bVar11 = true;
      break;
    default:
      bVar2 = bVar11;
      if (pcVar9[1] != '-') goto switchD_0012618e_caseD_65;
      pcVar9 = *local_668;
      local_668 = local_668 + wVar13;
      *local_668 = pcVar9;
      local_66c = local_66c - wVar13;
      bVar11 = false;
    }
    while (pcVar9 = local_660, bVar2 = bVar11, *pcVar15 != '\0') {
switchD_0012618e_caseD_65:
      puts("Usage: angband [options] [-- subopts]");
      puts("  -c             Select savefile with a menu; overrides -n");
      puts(
          "  -n             Start a new character (WARNING: overwrites default savefile without -u)"
          );
      puts("  -l             Lists all savefiles you can play");
      puts("  -w             Resurrect dead character (marks savefile)");
      puts("  -g             Request graphics mode");
      puts("  -u<who>        Use your <who> savefile");
      puts("  -d<dir>=<path> Override a specific directory with <path>. <path> can be:");
      for (lVar14 = 8; lVar14 != 0x140; lVar14 = lVar14 + 0x18) {
        printf("    %s (default is %s)\n",*(undefined8 *)(&UNK_002c8988 + lVar14),
               **(undefined8 **)((long)&change_path_values[0].name + lVar14));
      }
      puts("                 Multiple -d options are allowed.");
      puts("  -m<sys>        Use module <sys>, where <sys> can be:");
      for (lVar14 = 8; lVar14 != 0x38; lVar14 = lVar14 + 0x18) {
        printf("     %s   %s\n",*(undefined8 *)(&UNK_002c8ac8 + lVar14),
               *(undefined8 *)((long)&modules[0].name + lVar14));
      }
      quit((char *)0x0);
      wVar13 = L'\x02';
      bVar11 = bVar2;
    }
LAB_00126428:
    local_660 = pcVar9;
  }
  if (bVar11) {
    local_668[1] = (char *)0x0;
    local_66c = L'\x01';
  }
  quit_aux = quit_hook;
  if (local_660 != (char *)0x0) {
    ANGBAND_SYS = local_660;
  }
  pcVar9 = setlocale(0,"");
  if (pcVar9 != (char *)0x0) {
    pcVar9 = nl_langinfo(0xe);
    iVar7 = strcmp(pcVar9,"UTF-8");
    if (iVar7 != 0) {
      quit("Angband requires UTF-8 support");
    }
  }
  if (arg_name[0] == '\0') {
    ppVar10 = getpwuid(player_uid);
    if (((ppVar10 == (passwd *)0x0) || (pcVar9 = ppVar10->pw_name, pcVar9 == (char *)0x0)) ||
       (*pcVar9 == '\0')) {
      my_strcpy(arg_name,"PLAYER",0x20);
    }
    else {
      my_strcpy(arg_name,pcVar9,0x20);
      my_strcap(arg_name);
    }
    savefile_set_name(arg_name,true,false);
  }
  create_needed_dirs();
  for (lVar14 = 0x10; lVar14 != 0x40; lVar14 = lVar14 + 0x18) {
    pcVar9 = *(char **)(&change_path_values[0xc].setgid_ok + lVar14);
    if (((local_660 == (char *)0x0) || (iVar7 = strcmp(local_660,pcVar9), iVar7 == 0)) &&
       (ANGBAND_SYS = pcVar9,
       iVar7 = (**(code **)((long)&modules[0].name + lVar14))(local_66c,local_668), iVar7 == 0))
    goto LAB_0012656f;
  }
  quit("Unable to prepare any \'display module\'!");
LAB_0012656f:
  signals_init();
  cmd_get_hook = textui_get_cmd;
  reinit_hook = generic_reinit;
  init_display();
  init_angband();
  textui_init();
  pause_line(Term);
  mode = GAME_SELECT;
  if (!bVar4) {
    mode = (game_mode_type)bVar5;
  }
  play_game(mode);
  textui_cleanup();
  cleanup_angband();
  quit((char *)0x0);
  return L'\0';
}

Assistant:

int main(int argc, char *argv[])
{
	int i;
	bool new_game = false, select_game = false;
	bool done = false;

	const char *mstr = NULL;
	bool args = true;

	/* Save the "program name" XXX XXX XXX */
	argv0 = argv[0];

#ifdef UNIX

	/* Default permissions on files */
	(void)umask(022);

	/* Get the user id */
	player_uid = getuid();

#endif /* UNIX */

#ifdef SETGID

	/* Save the effective GID for later recall */
	player_egid = getegid();

#endif /* UNIX */


	/* Drop permissions */
	safe_setuid_drop();

	/* Get the file paths 
	 * Paths may be overriden by -d options, so this has to occur *before* 
	 * processing command line args */
	init_stuff();

	/* Process the command line arguments */
	for (i = 1; args && (i < argc); i++) {
		const char *arg = argv[i];

		/* Require proper options */
		if (*arg++ != '-') goto usage;

		/* Analyze option */
		switch (*arg++)
		{
			case 'c':
				select_game = true;
				break;

			case 'l':
				list_saves();
				exit(0);

			case 'n':
				new_game = true;
				break;

			case 'w':
				arg_wizard = true;
				break;

			case 'g':
				/* Default graphics tile */
				/* in graphics.txt, 2 corresponds to adam bolt's tiles */
				arg_graphics = 2; 
				if (*arg) arg_graphics = atoi(arg);
				break;

			case 'u': {
				if (!*arg) goto usage;

				my_strcpy(arg_name, arg, sizeof(arg_name));

				/* The difference here is because on setgid we have to be
				 * careful to only let the player have savefiles stored in
				 * the central save directory.  Sanitising input using
				 * player_safe_name() removes anything like that.
				 *
				 * But if the player is running with per-user saves, they
				 * can do whatever the hell they want.
				 */
#ifdef SETGID
				savefile_set_name(arg, true, false);
#else
				savefile_set_name(arg, false, false);
#endif /* SETGID */

				continue;
			}

			case 'f':
				arg_force_name = true;
				break;

			case 'm':
				if (!*arg) goto usage;
				mstr = arg;
				continue;
#ifdef SOUND
			case 's':
				if (!*arg) goto usage;
				soundstr = arg;
				continue;
#endif
			case 'd':
				change_path(arg);
				continue;

			case '-':
				argv[i] = argv[0];
				argc = argc - i;
				argv = argv + i;
				args = false;
				break;

			default:
			usage:
				puts("Usage: angband [options] [-- subopts]");
				puts("  -c             Select savefile with a menu; overrides -n");
				puts("  -n             Start a new character (WARNING: overwrites default savefile without -u)");
				puts("  -l             Lists all savefiles you can play");
				puts("  -w             Resurrect dead character (marks savefile)");
				puts("  -g             Request graphics mode");
				puts("  -u<who>        Use your <who> savefile");
				puts("  -d<dir>=<path> Override a specific directory with <path>. <path> can be:");
				for (i = 0; i < (int)N_ELEMENTS(change_path_values); i++) {
#ifdef SETGID
					if (!change_path_values[i].setgid_ok) continue;
#endif
					printf("    %s (default is %s)\n", change_path_values[i].name, *change_path_values[i].path);
				}
				puts("                 Multiple -d options are allowed.");
#ifdef SOUND
				puts("  -s<mod>        Use sound module <sys>:");
				print_sound_help();
#endif
				puts("  -m<sys>        Use module <sys>, where <sys> can be:");

				/* Print the name and help for each available module */
				for (i = 0; i < (int)N_ELEMENTS(modules); i++)
					printf("     %s   %s\n",
					       modules[i].name, modules[i].help);

				/* Actually abort the process */
				quit(NULL);
		}
		if (*arg) goto usage;
	}

	/* Hack -- Forget standard args */
	if (args) {
		argc = 1;
		argv[1] = NULL;
	}

	/* Install "quit" hook */
	quit_aux = quit_hook;

	/* If we were told which mode to use, then use it */
	if (mstr)
		ANGBAND_SYS = mstr;
#if !defined(WINDOWS) && !defined(DJGPP)
	if (setlocale(LC_CTYPE, "")) {
		/* Require UTF-8 */
		if (!streq(nl_langinfo(CODESET), "UTF-8"))
			quit("Angband requires UTF-8 support");
	}
#endif

#ifdef UNIX

	/* Get the "user name" as default player name, unless set with -u switch */
	if (!arg_name[0]) {
		user_name(arg_name, sizeof(arg_name), player_uid);

		/* Sanitise name and set as savefile */
		savefile_set_name(arg_name, true, false);
	}

	/* Create any missing directories */
	create_needed_dirs();

#endif /* UNIX */

	/* Try the modules in the order specified by modules[] */
	for (i = 0; i < (int)N_ELEMENTS(modules); i++) {
		/* User requested a specific module? */
		if (!mstr || (streq(mstr, modules[i].name))) {
			ANGBAND_SYS = modules[i].name;
			if (0 == modules[i].init(argc, argv)) {
				done = true;
				break;
			}
		}
	}

	/* Make sure we have a display! */
	if (!done) quit("Unable to prepare any 'display module'!");

	/* Catch nasty signals */
	signals_init();

	/* Set up the command hook */
	cmd_get_hook = textui_get_cmd;

	/*
	 * Set action that needs to be done if restarting without exiting.
	 * Also need to do it now.
	 */
#ifdef SOUND
	saved_argc = argc;
	saved_argv = argv;
#endif
	reinit_hook = generic_reinit;
	generic_reinit();

	/* Set up the display handlers and things. */
	init_display();
	init_angband();
	textui_init();

	/* Wait for response */
	pause_line(Term);

	/* Play the game */
	play_game((select_game) ?
		GAME_SELECT : ((new_game) ? GAME_NEW : GAME_LOAD));

	/* Free resources */
	textui_cleanup();
	cleanup_angband();
#ifdef SOUND
	close_sound();
#endif

	/* Quit */
	quit(NULL);

	/* Exit */
	return (0);
}